

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<long,_6> * __thiscall
TPZManVector<long,_6>::operator=(TPZManVector<long,_6> *this,TPZManVector<long,_6> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  long *plVar4;
  TPZManVector<long,_6> *in_RSI;
  TPZManVector<long,_6> *in_RDI;
  int64_t i;
  int64_t nel;
  long local_20;
  
  if (in_RDI != in_RSI) {
    uVar2 = TPZVec<long>::NElements(&in_RSI->super_TPZVec<long>);
    if ((((in_RDI->super_TPZVec<long>).fNAlloc < (long)uVar2) &&
        ((in_RDI->super_TPZVec<long>).fStore != (long *)0x0)) &&
       ((in_RDI->super_TPZVec<long>).fStore != in_RDI->fExtAlloc)) {
      plVar4 = (in_RDI->super_TPZVec<long>).fStore;
      if (plVar4 != (long *)0x0) {
        operator_delete__(plVar4);
      }
      (in_RDI->super_TPZVec<long>).fStore = (long *)0x0;
      (in_RDI->super_TPZVec<long>).fNAlloc = 0;
    }
    if ((long)uVar2 < 7) {
      if (((in_RDI->super_TPZVec<long>).fStore != in_RDI->fExtAlloc) &&
         (plVar4 = (in_RDI->super_TPZVec<long>).fStore, plVar4 != (long *)0x0)) {
        operator_delete__(plVar4);
      }
      (in_RDI->super_TPZVec<long>).fNAlloc = 0;
      (in_RDI->super_TPZVec<long>).fStore = in_RDI->fExtAlloc;
      (in_RDI->super_TPZVec<long>).fNElements = uVar2;
    }
    else if ((in_RDI->super_TPZVec<long>).fNAlloc < (long)uVar2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2;
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      plVar4 = (long *)operator_new__(uVar3);
      (in_RDI->super_TPZVec<long>).fStore = plVar4;
      (in_RDI->super_TPZVec<long>).fNAlloc = uVar2;
      (in_RDI->super_TPZVec<long>).fNElements = uVar2;
    }
    else {
      (in_RDI->super_TPZVec<long>).fNElements = uVar2;
    }
    for (local_20 = 0; local_20 < (long)uVar2; local_20 = local_20 + 1) {
      (in_RDI->super_TPZVec<long>).fStore[local_20] = (in_RSI->super_TPZVec<long>).fStore[local_20];
    }
  }
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}